

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O2

gdImagePtr gdImageNeuQuant(gdImagePtr im,int max_color,int sample_factor)

{
  int *piVar1;
  uchar *puVar2;
  int iVar3;
  uint uVar4;
  byte *thepic;
  long lVar5;
  nn_quant *nnq;
  gdImagePtr pgVar6;
  gdImagePtr pgVar7;
  byte *pbVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  byte bVar12;
  gdImagePtr pgVar13;
  bool bVar14;
  uchar map [256] [4];
  int remap [256];
  
  iVar9 = 3;
  if (0 < sample_factor) {
    iVar9 = sample_factor;
  }
  iVar3 = overflow2(im->sx,im->sy);
  if (((iVar3 != 0) || (iVar3 = overflow2(im->sy * im->sx,4), iVar3 != 0)) ||
     (thepic = (byte *)gdMalloc((long)(im->sx * im->sy * 4)), thepic == (byte *)0x0)) {
    return (gdImagePtr)0x0;
  }
  pbVar8 = thepic;
  for (lVar5 = 0; lVar5 < im->sy; lVar5 = lVar5 + 1) {
    piVar1 = im->tpixels[lVar5];
    for (lVar11 = 0; (int)lVar11 < im->sx; lVar11 = lVar11 + 1) {
      iVar3 = piVar1[lVar11];
      if (im->trueColor == 0) {
        bVar12 = (byte)im->alpha[iVar3];
      }
      else {
        bVar12 = (byte)((uint)iVar3 >> 0x18) & 0x7f;
      }
      *pbVar8 = bVar12;
      if (im->trueColor == 0) {
        bVar12 = (byte)im->red[iVar3];
      }
      else {
        bVar12 = (byte)((uint)iVar3 >> 0x10);
      }
      pbVar8[1] = bVar12;
      iVar10 = iVar3;
      if (im->trueColor == 0) {
        iVar10 = im->blue[iVar3];
      }
      pbVar8[2] = (byte)iVar10;
      if (im->trueColor == 0) {
        bVar12 = (byte)im->green[iVar3];
      }
      else {
        bVar12 = (byte)((uint)iVar3 >> 8);
      }
      pbVar8[3] = bVar12;
      pbVar8 = pbVar8 + 4;
    }
  }
  nnq = (nn_quant *)gdMalloc(0x2098);
  pgVar7 = (gdImagePtr)0x0;
  if (nnq != (nn_quant *)0x0) {
    initnet(nnq,thepic,im->sy * im->sx * 4,iVar9,max_color);
    learn(nnq,1);
    unbiasnet(nnq);
    getcolormap(nnq,map[0]);
    inxbuild(nnq);
    iVar9 = max_color + -1;
    pgVar13 = (gdImagePtr)(ulong)(uint)max_color;
    if (max_color < 1) {
      pgVar13 = pgVar7;
    }
    for (pgVar6 = (gdImagePtr)0x0; iVar3 = (int)pgVar7, pgVar13 != pgVar6;
        pgVar6 = (gdImagePtr)((long)&pgVar6->pixels + 1)) {
      bVar14 = map[(long)pgVar6][3] == 0xff;
      iVar10 = iVar3;
      if (bVar14) {
        iVar10 = iVar9;
      }
      iVar9 = iVar9 - (uint)bVar14;
      pgVar7 = (gdImagePtr)(ulong)(iVar3 + (uint)!bVar14);
      remap[(long)pgVar6] = iVar10;
    }
    if (iVar3 == iVar9 + 1) {
      pgVar7 = gdImageCreate(im->sx,im->sy);
      if (pgVar7 != (gdImagePtr)0x0) {
        for (pgVar6 = (gdImagePtr)0x0; pgVar13 != pgVar6;
            pgVar6 = (gdImagePtr)((long)&pgVar6->pixels + 1)) {
          iVar9 = remap[(long)pgVar6];
          pgVar7->red[iVar9] = (uint)map[(long)pgVar6][0];
          pgVar7->green[iVar9] = (uint)map[(long)pgVar6][1];
          pgVar7->blue[iVar9] = (uint)map[(long)pgVar6][2];
          pgVar7->alpha[iVar9] = (uint)map[(long)pgVar6][3];
          pgVar7->open[iVar9] = 0;
          pgVar7->colorsTotal = pgVar7->colorsTotal + 1;
        }
        iVar9 = 0;
        for (lVar5 = 0; lVar5 < im->sy; lVar5 = lVar5 + 1) {
          puVar2 = pgVar7->pixels[lVar5];
          iVar3 = im->sx;
          iVar10 = iVar3 * iVar9;
          for (lVar11 = 0; lVar11 < iVar3; lVar11 = lVar11 + 1) {
            uVar4 = inxsearch(nnq,(uint)thepic[iVar10],(uint)thepic[iVar10 + 2],
                              (uint)thepic[iVar10 + 3],(uint)thepic[iVar10 + 1]);
            puVar2[lVar11] = (uchar)remap[uVar4];
            iVar3 = im->sx;
            iVar10 = iVar10 + 4;
          }
          iVar9 = iVar9 + 4;
        }
        goto LAB_0011c70c;
      }
    }
    else {
      gd_error("  internal logic error: remapped bot_idx = %d, top_idx = %d\n",pgVar7);
    }
    pgVar7 = (gdImagePtr)0x0;
  }
LAB_0011c70c:
  gdFree(thepic);
  if (nnq == (nn_quant *)0x0) {
    return pgVar7;
  }
  gdFree(nnq);
  return pgVar7;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageNeuQuant(gdImagePtr im, const int max_color, int sample_factor)
{
	const int newcolors = max_color;
	const int verbose = 1;

	int bot_idx, top_idx; /* for remapping of indices */
	int remap[MAXNETSIZE];
	int i,x;

	unsigned char map[MAXNETSIZE][4];
	unsigned char *d;

	nn_quant *nnq = NULL;

	int row;
	unsigned char *rgba = NULL;
	gdImagePtr dst = NULL;

	/* Default it to 3 */
	if (sample_factor < 1) {
		sample_factor = 3;
	}
	/* Start neuquant */
	/* Pierre:
	 * This implementation works with aligned contiguous buffer only
	 * Upcoming new buffers are contiguous and will be much faster.
	 * let don't bloat this code to support our good "old" 31bit format.
	 * It alos lets us convert palette image, if one likes to reduce
	 * a palette
	 */
	if (overflow2(gdImageSX(im), gdImageSY(im))
	        || overflow2(gdImageSX(im) * gdImageSY(im), 4)) {
		goto done;
	}
	rgba = (unsigned char *) gdMalloc(gdImageSX(im) * gdImageSY(im) * 4);
	if (!rgba) {
		goto done;
	}

	d = rgba;
	for (row = 0; row < gdImageSY(im); row++) {
		int *p = im->tpixels[row];
		register int c;

		for (i = 0; i < gdImageSX(im); i++) {
			c = *p;
			*d++ = gdImageAlpha(im, c);
			*d++ = gdImageRed(im, c);
			*d++ = gdImageBlue(im, c);
			*d++ = gdImageGreen(im, c);
			p++;
		}
	}

	nnq = (nn_quant *) gdMalloc(sizeof(nn_quant));
	if (!nnq) {
		goto done;
	}

	initnet(nnq, rgba, gdImageSY(im) * gdImageSX(im) * 4, sample_factor, newcolors);

	learn(nnq, verbose);
	unbiasnet(nnq);
	getcolormap(nnq, (unsigned char*)map);
	inxbuild(nnq);
	/* remapping colormap to eliminate opaque tRNS-chunk entries... */
	for (top_idx = newcolors-1, bot_idx = x = 0;  x < newcolors;  ++x) {
		if (map[x][3] == 255) { /* maxval */
			remap[x] = top_idx--;
		} else {
			remap[x] = bot_idx++;
		}
	}
	if (bot_idx != top_idx + 1) {
		gd_error("  internal logic error: remapped bot_idx = %d, top_idx = %d\n",
			 bot_idx, top_idx);
		goto done;
	}

	dst = gdImageCreate(gdImageSX(im), gdImageSY(im));
	if (!dst) {
		goto done;
	}

	for (x = 0; x < newcolors; ++x) {
		dst->red[remap[x]] = map[x][0];
		dst->green[remap[x]] = map[x][1];
		dst->blue[remap[x]] = map[x][2];
		dst->alpha[remap[x]] = map[x][3];
		dst->open[remap[x]] = 0;
		dst->colorsTotal++;
	}

	/* Do each image row */
	for ( row = 0; row < gdImageSY(im); ++row ) {
		int offset;
		unsigned char *p = dst->pixels[row];

		/* Assign the new colors */
		offset = row * gdImageSX(im) * 4;
		for(i=0; i < gdImageSX(im); i++) {
			p[i] = remap[
			           inxsearch(nnq, rgba[i * 4 + offset + ALPHA],
			                     rgba[i * 4 + offset + BLUE],
			                     rgba[i * 4 + offset + GREEN],
			                     rgba[i * 4 + offset + RED])
			       ];
		}
	}

done:
	if (rgba) {
		gdFree(rgba);
	}

	if (nnq) {
		gdFree(nnq);
	}
	return dst;
}